

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O0

int Abc_CommandBalance(Abc_Frame_t *pAbc,int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  Abc_Ntk_t *pAVar3;
  char *pcVar4;
  uint local_58;
  int fVerbose;
  int fExor;
  int fUpdateLevel;
  int fSelective;
  int fDuplicate;
  int c;
  Abc_Ntk_t *pNtkTemp;
  Abc_Ntk_t *pNtkRes;
  Abc_Ntk_t *pNtk;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  pAVar3 = Abc_FrameReadNtk(pAbc);
  fUpdateLevel = 0;
  fExor = 0;
  fVerbose = 1;
  bVar1 = false;
  local_58 = 0;
  Extra_UtilGetoptReset();
LAB_0026587a:
  iVar2 = Extra_UtilGetopt(argc,argv,"ldsxvh");
  if (iVar2 == -1) {
    if (pAVar3 == (Abc_Ntk_t *)0x0) {
      Abc_Print(-1,"Empty network.\n");
      pAbc_local._4_4_ = 1;
    }
    else {
      iVar2 = Abc_NtkIsStrash(pAVar3);
      if (iVar2 == 0) {
        pAVar3 = Abc_NtkStrash(pAVar3,0,0,0);
        if (pAVar3 == (Abc_Ntk_t *)0x0) {
          Abc_Print(-1,"Strashing before balancing has failed.\n");
          return 1;
        }
        if (bVar1) {
          pNtkTemp = Abc_NtkBalanceExor(pAVar3,fVerbose,local_58);
        }
        else {
          pNtkTemp = Abc_NtkBalance(pAVar3,fUpdateLevel,fExor,fVerbose);
        }
        Abc_NtkDelete(pAVar3);
      }
      else if (bVar1) {
        pNtkTemp = Abc_NtkBalanceExor(pAVar3,fVerbose,local_58);
      }
      else {
        pNtkTemp = Abc_NtkBalance(pAVar3,fUpdateLevel,fExor,fVerbose);
      }
      if (pNtkTemp == (Abc_Ntk_t *)0x0) {
        Abc_Print(-1,"Balancing has failed.\n");
        pAbc_local._4_4_ = 1;
      }
      else {
        Abc_FrameReplaceCurrentNetwork(pAbc,pNtkTemp);
        pAbc_local._4_4_ = 0;
      }
    }
    return pAbc_local._4_4_;
  }
  switch(iVar2) {
  case 100:
    fUpdateLevel = fUpdateLevel ^ 1;
    goto LAB_0026587a;
  default:
    break;
  case 0x68:
    break;
  case 0x6c:
    fVerbose = fVerbose ^ 1;
    goto LAB_0026587a;
  case 0x73:
    fExor = fExor ^ 1;
    goto LAB_0026587a;
  case 0x76:
    local_58 = local_58 ^ 1;
    goto LAB_0026587a;
  case 0x78:
    goto switchD_002658b8_caseD_78;
  }
  Abc_Print(-2,"usage: balance [-ldsxvh]\n");
  Abc_Print(-2,"\t        transforms the current network into a well-balanced AIG\n");
  pcVar4 = "no";
  if (fVerbose != 0) {
    pcVar4 = "yes";
  }
  Abc_Print(-2,"\t-l    : toggle minimizing the number of levels [default = %s]\n",pcVar4);
  pcVar4 = "no";
  if (fUpdateLevel != 0) {
    pcVar4 = "yes";
  }
  Abc_Print(-2,"\t-d    : toggle duplication of logic [default = %s]\n",pcVar4);
  pcVar4 = "no";
  if (fExor != 0) {
    pcVar4 = "yes";
  }
  Abc_Print(-2,"\t-s    : toggle duplication on the critical paths [default = %s]\n",pcVar4);
  pcVar4 = "no";
  if (bVar1) {
    pcVar4 = "yes";
  }
  Abc_Print(-2,"\t-x    : toggle balancing multi-input EXORs [default = %s]\n",pcVar4);
  pcVar4 = "no";
  if (local_58 != 0) {
    pcVar4 = "yes";
  }
  Abc_Print(-2,"\t-v    : print verbose information [default = %s]\n",pcVar4);
  Abc_Print(-2,"\t-h    : print the command usage\n");
  return 1;
switchD_002658b8_caseD_78:
  bVar1 = (bool)(bVar1 ^ 1);
  goto LAB_0026587a;
}

Assistant:

int Abc_CommandBalance( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Abc_Ntk_t * pNtk, * pNtkRes, * pNtkTemp;
    int c;
    int fDuplicate;
    int fSelective;
    int fUpdateLevel;
    int fExor;
    int fVerbose;
    pNtk = Abc_FrameReadNtk(pAbc);

    // set defaults
    fDuplicate   = 0;
    fSelective   = 0;
    fUpdateLevel = 1;
    fExor        = 0;
    fVerbose     = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "ldsxvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'l':
            fUpdateLevel ^= 1;
            break;
        case 'd':
            fDuplicate ^= 1;
            break;
        case 's':
            fSelective ^= 1;
            break;
        case 'x':
            fExor ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }

    if ( pNtk == NULL )
    {
        Abc_Print( -1, "Empty network.\n" );
        return 1;
    }
    // get the new network
    if ( Abc_NtkIsStrash(pNtk) )
    {
        if ( fExor )
            pNtkRes = Abc_NtkBalanceExor( pNtk, fUpdateLevel, fVerbose );
        else
            pNtkRes = Abc_NtkBalance( pNtk, fDuplicate, fSelective, fUpdateLevel );
    }
    else
    {
        pNtkTemp = Abc_NtkStrash( pNtk, 0, 0, 0 );
        if ( pNtkTemp == NULL )
        {
            Abc_Print( -1, "Strashing before balancing has failed.\n" );
            return 1;
        }
        if ( fExor )
            pNtkRes = Abc_NtkBalanceExor( pNtkTemp, fUpdateLevel, fVerbose );
        else
            pNtkRes = Abc_NtkBalance( pNtkTemp, fDuplicate, fSelective, fUpdateLevel );
        Abc_NtkDelete( pNtkTemp );
    }

    // check if balancing worked
    if ( pNtkRes == NULL )
    {
        Abc_Print( -1, "Balancing has failed.\n" );
        return 1;
    }
    // replace the current network
    Abc_FrameReplaceCurrentNetwork( pAbc, pNtkRes );
    return 0;

usage:
    Abc_Print( -2, "usage: balance [-ldsxvh]\n" );
    Abc_Print( -2, "\t        transforms the current network into a well-balanced AIG\n" );
    Abc_Print( -2, "\t-l    : toggle minimizing the number of levels [default = %s]\n", fUpdateLevel? "yes": "no" );
    Abc_Print( -2, "\t-d    : toggle duplication of logic [default = %s]\n", fDuplicate? "yes": "no" );
    Abc_Print( -2, "\t-s    : toggle duplication on the critical paths [default = %s]\n", fSelective? "yes": "no" );
    Abc_Print( -2, "\t-x    : toggle balancing multi-input EXORs [default = %s]\n", fExor? "yes": "no" );
    Abc_Print( -2, "\t-v    : print verbose information [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h    : print the command usage\n");
    return 1;
}